

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

rel_iterator * __thiscall dg::vr::ValueRelations::end_related(ValueRelations *this,V param_2)

{
  _Rb_tree_header *p_Var1;
  rel_iterator *in_RDI;
  
  in_RDI->vr = this;
  (in_RDI->related)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->related)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(in_RDI->related)._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->related)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->related)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->current).second.bits.super__Base_bitset<1UL>._M_w = 0;
  (in_RDI->related)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->bucketIt)._M_node = (_Base_ptr)0x0;
  (in_RDI->valueIt)._M_current = (Value **)0x0;
  (in_RDI->current).first = (Value *)0x0;
  in_RDI->isEnd = true;
  return in_RDI;
}

Assistant:

ValueRelations::rel_iterator ValueRelations::end_related(V /*val*/) const {
    return rel_iterator(*this);
}